

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ccm.c
# Opt level: O0

int mbedtls_ccm_set_lengths
              (mbedtls_ccm_context *ctx,size_t total_ad_len,size_t plaintext_len,size_t tag_len)

{
  size_t tag_len_local;
  size_t plaintext_len_local;
  size_t total_ad_len_local;
  mbedtls_ccm_context *ctx_local;
  
  if (((tag_len == 2) || (0x10 < tag_len)) || ((tag_len & 1) != 0)) {
    ctx_local._4_4_ = -0xd;
  }
  else if (total_ad_len < 0xff00) {
    ctx->plaintext_len = plaintext_len;
    ctx->add_len = total_ad_len;
    ctx->tag_len = tag_len;
    ctx->processed = 0;
    ctx->state = ctx->state | 2;
    ctx_local._4_4_ = ccm_calculate_first_block_if_ready(ctx);
  }
  else {
    ctx_local._4_4_ = -0xd;
  }
  return ctx_local._4_4_;
}

Assistant:

int mbedtls_ccm_set_lengths(mbedtls_ccm_context *ctx,
                            size_t total_ad_len,
                            size_t plaintext_len,
                            size_t tag_len)
{
    /*
     * Check length requirements: SP800-38C A.1
     * Additional requirement: a < 2^16 - 2^8 to simplify the code.
     * 'length' checked later (when writing it to the first block)
     *
     * Also, loosen the requirements to enable support for CCM* (IEEE 802.15.4).
     */
    if (tag_len == 2 || tag_len > 16 || tag_len % 2 != 0) {
        return MBEDTLS_ERR_CCM_BAD_INPUT;
    }

    if (total_ad_len >= 0xFF00) {
        return MBEDTLS_ERR_CCM_BAD_INPUT;
    }

    ctx->plaintext_len = plaintext_len;
    ctx->add_len = total_ad_len;
    ctx->tag_len = tag_len;
    ctx->processed = 0;

    ctx->state |= CCM_STATE__LENGTHS_SET;
    return ccm_calculate_first_block_if_ready(ctx);
}